

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_Truth3VarN(uint **puCanons,char ***puPhases,char **ppCounters)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  uint *__ptr;
  char *__ptr_00;
  char **__ptr_01;
  ulong uVar4;
  long lVar5;
  int Polarity;
  ulong uVar6;
  
  __ptr = (uint *)calloc(1,0x400);
  __ptr_00 = (char *)calloc(1,0x100);
  __ptr_01 = (char **)Extra_ArrayAlloc(0x100,8,1);
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar6 = lVar5 * 0x1010101;
    uVar4 = (ulong)__ptr[lVar5];
    if (uVar4 == 0) {
      for (Polarity = 0; Polarity != 8; Polarity = Polarity + 1) {
        uVar3 = Extra_TruthPolarize((uint)lVar5,Polarity,3);
        if (((ulong)__ptr[uVar3] == 0) && (lVar5 != 0 || Polarity == 0)) {
          __ptr[uVar3] = (uint)uVar6;
          *__ptr_01[uVar3] = (char)Polarity;
          __ptr_00[uVar3] = '\x01';
        }
        else {
          if (uVar6 - __ptr[uVar3] != 0) {
            __assert_fail("uCanons[uPhase] == uTruth32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                          ,0x30f,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
          }
          cVar1 = __ptr_00[uVar3];
          if ((long)cVar1 < 8) {
            pcVar2 = __ptr_01[uVar3];
            __ptr_00[uVar3] = cVar1 + '\x01';
            pcVar2[cVar1] = (char)Polarity;
          }
        }
      }
    }
    else if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
      __assert_fail("uTruth32 > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x300,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
    }
  }
  if (puCanons == (uint **)0x0) {
    free(__ptr);
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char ***)0x0) {
    free(__ptr_01);
  }
  else {
    *puPhases = __ptr_01;
  }
  if (ppCounters != (char **)0x0) {
    *ppCounters = __ptr_00;
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters )
{
    int nPhasesMax = 8;
    unsigned * uCanons;
    unsigned uTruth, uPhase, uTruth32;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 8);
    uCanons = ABC_ALLOC( unsigned, nFuncs );
    memset( uCanons, 0, sizeof(unsigned) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        uTruth32 = ((uTruth << 24) | (uTruth << 16) | (uTruth << 8) | uTruth);
        if ( uCanons[uTruth] )
        {
            assert( uTruth32 > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 8; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 3 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth32;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth32 );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 3N-classes = %d.\n", nClasses );
}